

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::all2all<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs,comm *comm)

{
  int iVar1;
  size_type sVar2;
  const_reference msgs_00;
  size_t size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(msgs);
  iVar1 = mxx::comm::size(comm);
  if ((int)sVar2 % iVar1 != 0) {
    assert_fail("(int)msgs.size() % comm.size() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x4b2,"all2all");
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(msgs);
  iVar1 = mxx::comm::size(comm);
  msgs_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](msgs,0);
  all2all<unsigned_long>(__return_storage_ptr__,msgs_00,sVar2 / (ulong)(long)iVar1,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const std::vector<T>& msgs, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT((int)msgs.size() % comm.size() == 0);
    size_t size = msgs.size() / comm.size();
    std::vector<T> result = all2all(&msgs[0], size, comm);
    return result;
}